

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  mapped_type *this;
  long lVar2;
  int iVar3;
  Employee *item;
  pointer __x;
  pointer pEVar4;
  initializer_list<Employee> __l;
  initializer_list<float> __l_00;
  int age_thresh;
  vector<Employee,_std::allocator<Employee>_> employees;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_218;
  string local_1e8;
  value_type *local_1c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  grouped;
  vector<Employee,_std::allocator<Employee>_> age_gt_40;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  grouped_transformed;
  string local_f8 [32];
  undefined8 local_d8;
  undefined4 local_d0;
  string local_c8 [32];
  undefined8 local_a8;
  undefined4 local_a0;
  string local_98 [32];
  undefined8 local_78;
  undefined4 local_70;
  string local_68 [32];
  undefined8 local_48;
  undefined4 local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&grouped_transformed,"Fatih",(allocator<char> *)&grouped);
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x2300000001;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_node_count =
       CONCAT44(grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                0x4604d000);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"Elif",(allocator<char> *)&local_218);
  local_d8 = 0x1c00000000;
  local_d0 = 0x45c67000;
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"Erkin",(allocator<char> *)&local_1e8)
  ;
  local_a8 = 0x2b00000001;
  local_a0 = 0x46147000;
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"Mehmet",(allocator<char> *)&local_168);
  local_78 = 0x2e00000001;
  local_70 = 0x46241000;
  std::__cxx11::string::string<std::allocator<char>>(local_68,"Melis",(allocator<char> *)&local_148)
  ;
  local_48 = 0x3000000000;
  local_40 = 0x46435000;
  __l._M_len = 5;
  __l._M_array = (iterator)&grouped_transformed;
  std::vector<Employee,_std::allocator<Employee>_>::vector
            (&employees,__l,(allocator_type *)&age_gt_40);
  lVar2 = 0xc0;
  do {
    std::__cxx11::string::~string(local_f8 + lVar2 + -0x30);
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x30);
  poVar1 = std::operator<<((ostream *)&std::cout,"First Employee:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  operator<<(poVar1,employees.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
                    super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"All Employees:");
  std::endl<char,std::char_traits<char>>(poVar1);
  print<std::vector<Employee,_std::allocator<Employee>_>_>(&employees);
  age_thresh = 0x28;
  poVar1 = std::operator<<((ostream *)&std::cout,"Employees older than 40 years old:");
  std::endl<char,std::char_traits<char>>(poVar1);
  filter<std::vector<Employee,std::allocator<Employee>>,main::__0>
            (&age_gt_40,&employees,(anon_class_8_1_3dfc913a)&age_thresh);
  print<std::vector<Employee,_std::allocator<Employee>_>_>(&age_gt_40);
  age_thresh = 0x2d;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Employees older than 45 years old (again in functional composition):");
  std::endl<char,std::char_traits<char>>(poVar1);
  filter<std::vector<Employee,std::allocator<Employee>>,main::__0>
            ((vector<Employee,_std::allocator<Employee>_> *)&grouped_transformed,&employees,
             (anon_class_8_1_3dfc913a)&age_thresh);
  print<std::vector<Employee,_std::allocator<Employee>_>_>
            ((vector<Employee,_std::allocator<Employee>_> *)&grouped_transformed);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)&grouped_transformed);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Female employees who take less salary than 9000TL:");
  std::endl<char,std::char_traits<char>>(poVar1);
  pEVar4 = employees.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
           super__Vector_impl_data._M_finish;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  grouped_transformed._M_t._M_impl._0_8_ = 0;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  for (__x = employees.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pEVar4; __x = __x + 1) {
    if ((__x->salary <= 9000.0 && __x->salary != 9000.0) && (__x->gender == Female)) {
      std::vector<Employee,_std::allocator<Employee>_>::push_back
                ((vector<Employee,_std::allocator<Employee>_> *)&grouped_transformed,__x);
    }
  }
  grouped._M_t._M_impl._0_8_ = grouped_transformed._M_t._M_impl._0_8_;
  grouped._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  grouped._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  grouped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  grouped_transformed._M_t._M_impl._0_8_ = 0;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)&grouped_transformed);
  print<std::vector<Employee,_std::allocator<Employee>_>_>
            ((vector<Employee,_std::allocator<Employee>_> *)&grouped);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)&grouped);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Employees grouped by age ranges of 10 year increments:");
  std::endl<char,std::char_traits<char>>(poVar1);
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  grouped_transformed._M_t._M_impl._0_8_ = 0;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c0 = employees.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
              super__Vector_impl_data._M_finish;
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pEVar4 = employees.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar4 != local_1c0; pEVar4 = pEVar4 + 1) {
    iVar3 = pEVar4->age - pEVar4->age % 10;
    std::__cxx11::to_string(&local_1e8,iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   &local_1e8,"..");
    std::__cxx11::to_string(&local_168,iVar3 + 9);
    std::operator+(&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   &local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1e8);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
                         *)&grouped_transformed,&local_148);
    std::vector<Employee,_std::allocator<Employee>_>::push_back(this,pEVar4);
    std::__cxx11::string::~string((string *)&local_148);
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&grouped._M_t._M_impl.super__Rb_tree_header,
             &grouped_transformed._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
               *)&grouped_transformed);
  print<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>>(&grouped);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Number of employees available in age ranges of 10 year increments:");
  std::endl<char,std::char_traits<char>>(poVar1);
  transform<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>,main::__3>
            (&grouped_transformed,&grouped);
  print<std::__cxx11::string,unsigned_long>(&grouped_transformed);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Number of employees available in age ranges of 10 year increments (again):"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  transform<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>,main::__3>
            (&local_218,&grouped);
  print<std::__cxx11::string,unsigned_long>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)&local_218);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_218);
  local_218._M_impl.super__Rb_tree_header._M_header._M_color = 0x1e;
  local_218._M_impl._0_8_ = 0x140000000a;
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    iVar3 = *(int *)(&local_218._M_impl.field_0x0 + lVar2);
    *(int *)(&local_218._M_impl.field_0x0 + lVar2) = iVar3 * iVar3;
  }
  local_1e8._M_dataplus._M_p = (pointer)local_218._M_impl._0_8_;
  local_1e8._M_string_length =
       CONCAT44(local_1e8._M_string_length._4_4_,
                local_218._M_impl.super__Rb_tree_header._M_header._M_color);
  print<std::array<int,_3UL>_>((array<int,_3UL> *)&local_1e8);
  local_1e8._M_dataplus._M_p = (pointer)0x400ccccd3f8ccccd;
  local_1e8._M_string_length = 0x408ccccd40533333;
  local_218._M_impl._0_16_ = reverse<std::array<float,4ul>>((array<float,_4UL> *)&local_1e8);
  print<std::array<float,_4UL>_>((array<float,_4UL> *)&local_218);
  local_168._M_dataplus._M_p = (pointer)0x400ccccd3f8ccccd;
  local_168._M_string_length = 0x408ccccd40533333;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_168;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_1e8,__l_00,(allocator_type *)&local_148
            );
  reverse<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)&local_218,
             (vector<float,_std::allocator<float>_> *)&local_1e8);
  print<std::vector<float,_std::allocator<float>_>_>
            ((vector<float,_std::allocator<float>_> *)&local_218);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_218);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_1e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&grouped_transformed._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  ::~_Rb_tree(&grouped._M_t);
  std::vector<Employee,_std::allocator<Employee>_>::~vector(&age_gt_40);
  std::vector<Employee,_std::allocator<Employee>_>::~vector(&employees);
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto employees = std::vector<Employee>{
        {"Fatih", Male, 35, 8500},
        {"Elif", Female, 28, 6350},
        {"Erkin", Male, 43, 9500},
        {"Mehmet", Male, 46, 10500},
        {"Melis", Female, 48, 12500},
        };

    // Q1) (5pts) Make employee directly sendable to the console
    std::cout << "First Employee:" << std::endl << employees[0] << std::endl;
    // Fatih, Male, 35, 8500TL

    // Q2) (5pts) Create a print overload that can print "employees" variable
    std::cout << "All Employees:" << std::endl;
    print(employees);
    // [Fatih, Male, 35, 8500TL]; [Elif, Female, 28, 6350TL]; [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    auto age_thresh = 40;

    // Q3) (5pts) Create a filter overload that can work with any kind of containers. Make it work with "employees"
    std::cout << "Employees older than 40 years old:" << std::endl;
    auto lambda_filter = [&age_thresh](const Employee& e) { return e.age > age_thresh; };
    auto age_gt_40 = filter(employees, lambda_filter);
    print(age_gt_40);
    // [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q4a) (5pts) Apply filter to a container by & operator
    // Q4b) (5pts) Send container to console by piping it to PRINT with | operator.
    age_thresh = 45;
    std::cout << "Employees older than 45 years old (again in functional composition):" << std::endl;
    employees & lambda_filter | PRINT;
    // [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q5) (5pts) Make below code work.
    std::cout << "Female employees who take less salary than 9000TL:" << std::endl;
    print(filter(employees, [](const Employee& e) { return e.salary < 9000 && e.gender == Female; }));
    // [Elif, Female, 28, 6350TL]

    // Q6a) (15pts) Create a group_by algorithm that can group elements of a container by a specific criterion
    // Q6b) (5pts) Group employees by age ranges of 10 year increments by filling in lambda_group below
    // Q6c) (5pts) Make the grouped result printable via print(grouped) as below
    std::cout << "Employees grouped by age ranges of 10 year increments:" << std::endl;
    auto lambda_group = [](const Employee& e) {
        auto a = e.age/10*10; // note: division of integer truncates the result.
        auto b = a+9;
        return std::to_string(a) + ".." + std::to_string(b);
    };
    auto grouped = group_by(employees, lambda_group);
    print(grouped);
    // <20..29>: [Elif, Female, 28, 6350TL]
    // <30..39>: [Fatih, Male, 35, 8500TL]
    // <40..49>: [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q7a) (10pts) Create a transform algorithm that can work on "grouped" variable.
    // Q7b) (5pts) Write necessary transformation lambda for aggregating each group's element count.
    // Q7c) (5pts) Make the grouped and transformed result printable via print(grouped_transformed) as below
    std::cout << "Number of employees available in age ranges of 10 year increments:" << std::endl;
    auto lambda_transform = [](const auto& pair) {
        using Key = typename remove_const<decltype(pair.first)>::type;
        using Value = size_t;
        return std::pair<Key, Value>{pair.first, pair.second.size()};
    };
    auto grouped_transformed = transform(grouped, lambda_transform);
    print(grouped_transformed);
    // <20..29>: 1
    // <30..39>: 1
    // <40..49>: 3

    // Q8) (10pts) Make the below code work as the same as Q7's code block
    std::cout << "Number of employees available in age ranges of 10 year increments (again):" << std::endl;
    grouped | lambda_transform | PRINT;
    // <20..29>: 1
    // <30..39>: 1
    // <40..49>: 3

    // Q9) (5pts) Make below line work
    std::array<int, 3>{10, 20, 30} | [](int a) { return a*a; } | PRINT;
    // [100]; [400]; [900]

    // Q10) Overload "operator-" to get the reverse of passed container
    // Q10a) (5pts) Make it work with array containers with the result pipable to PRINT as below
    // Q10b) (5pts) Make it work with other containers with the result pipable to PRINT as below
    -std::array<float, 4>{1.1, 2.2, 3.3, 4.4} | PRINT;
    // [4.4]; [3.3]; [2.2]; [1.1]
    -std::vector<float>{1.1, 2.2, 3.3, 4.4} | PRINT;
    // [4.4]; [3.3]; [2.2]; [1.1]

    return 0;
}